

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Expr * __thiscall SQCompilation::SQParser::PrefixedExpr(SQParser *this)

{
  SQInteger SVar1;
  SQInteger SVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  Id *this_00;
  SQParser *pSVar6;
  SQParser *in_RDI;
  SQInteger *in_stack_000000c8;
  SQParser *in_stack_000000d0;
  CallExpr *call;
  SQInteger c_1;
  SQInteger l_1;
  SQInteger nullcall;
  SQInteger diff;
  Expr *key;
  Expr *receiver_1;
  Id *id;
  Expr *receiver;
  SQInteger c;
  SQInteger l;
  SQInteger tok;
  bool isTypeMethod;
  bool nextIsNullable;
  Expr *e;
  SQInteger pos;
  NestingChecker nc;
  SQParser *in_stack_fffffffffffffe68;
  SQParser *in_stack_fffffffffffffe70;
  CallExpr *in_stack_fffffffffffffe78;
  SQParser *in_stack_fffffffffffffe80;
  Arena *in_stack_fffffffffffffe88;
  IncForm args_2;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  undefined3 uVar7;
  uint in_stack_fffffffffffffe9c;
  SQParser *in_stack_fffffffffffffea0;
  SQInteger in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  SQExpressionContext in_stack_ffffffffffffff3c;
  int local_58;
  int local_50;
  bool local_3d;
  SQParser *local_30;
  NestingChecker local_20;
  SQParser *local_8;
  
  NestingChecker::NestingChecker
            ((NestingChecker *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_30 = (SQParser *)Factor(in_stack_000000d0,in_stack_000000c8);
  local_3d = false;
LAB_001b9bb3:
  while( true ) {
    NestingChecker::inc((NestingChecker *)in_stack_fffffffffffffe70);
    args_2 = (IncForm)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    pSVar6 = (SQParser *)in_RDI->_token;
    if (pSVar6 != (SQParser *)0x28) break;
LAB_001ba17e:
    if ((((in_RDI->_lex)._prevflags & 1) != 0) && (in_RDI->_token == 0x28)) {
      reportDiagnostic(in_RDI,0x37);
    }
    uVar7 = (undefined3)in_stack_fffffffffffffe9c;
    in_stack_fffffffffffffe9c = CONCAT13(1,uVar7);
    if (in_RDI->_token != 0x149) {
      in_stack_fffffffffffffe9c = CONCAT13(local_3d,uVar7);
    }
    local_3d = in_stack_fffffffffffffe9c >> 0x18 != 0;
    in_stack_fffffffffffffe98 = Node::lineStart((Node *)local_30);
    in_stack_fffffffffffffe94 = Node::columnStart((Node *)local_30);
    in_stack_fffffffffffffe88 = arena(in_RDI);
    local_30 = (SQParser *)
               newNode<SQCompilation::CallExpr,Arena*,SQCompilation::Expr*,long>
                         (in_stack_fffffffffffffea0,
                          (Arena *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                          (Expr *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          (long)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffe80 = local_30;
    if (in_RDI->_token == 0x28) {
      checkSuspiciousBracket(in_stack_fffffffffffffe70);
    }
    Lex(in_stack_fffffffffffffe80);
    while (in_RDI->_token != 0x29) {
      in_stack_fffffffffffffe70 = local_30;
      in_stack_fffffffffffffe78 = (CallExpr *)Expression(pSVar6,in_stack_ffffffffffffff3c);
      CallExpr::addArgument((CallExpr *)in_stack_fffffffffffffe70,(Expr *)in_stack_fffffffffffffe68)
      ;
      if (in_RDI->_token == 0x2c) {
        Lex(in_stack_fffffffffffffe80);
      }
    }
    setCoordinates<SQCompilation::CallExpr>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               (SQInteger)in_stack_fffffffffffffe70,(SQInteger)in_stack_fffffffffffffe68);
    Lex(in_stack_fffffffffffffe80);
  }
  if (pSVar6 != (SQParser *)0x2e) {
    if (pSVar6 == (SQParser *)0x5b) {
LAB_001b9efd:
      if ((in_RDI->_token == 0x147) || (local_3d != false)) {
        local_3d = true;
      }
      if ((in_RDI->_lex)._prevtoken == 10) {
        reportDiagnostic(in_RDI,0x1f);
      }
      if (in_RDI->_token == 0x5b) {
        checkSuspiciousBracket(in_stack_fffffffffffffe70);
      }
      Lex(in_stack_fffffffffffffe80);
      Expression(pSVar6,in_stack_ffffffffffffff3c);
      newNode<SQCompilation::GetSlotExpr,SQCompilation::Expr*,SQCompilation::Expr*,bool>
                (in_stack_fffffffffffffea0,
                 (Expr *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (Expr *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 SUB81((ulong)in_stack_fffffffffffffe88 >> 0x38,0));
      Node::lineStart((Node *)local_30);
      Node::columnStart((Node *)local_30);
      local_30 = (SQParser *)
                 setCoordinates<SQCompilation::GetSlotExpr>
                           (in_stack_fffffffffffffe80,(GetSlotExpr *)in_stack_fffffffffffffe78,
                            (SQInteger)in_stack_fffffffffffffe70,
                            (SQInteger)in_stack_fffffffffffffe68);
      Expect((SQParser *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
      goto LAB_001b9bb3;
    }
    if ((undefined1 *)((long)&pSVar6[-2]._lang_features + 1U) < (undefined1 *)0x2) {
      bVar3 = IsEndOfStatement(in_RDI);
      if (bVar3) {
        local_8 = local_30;
      }
      else {
        newNode<SQCompilation::IncExpr,SQCompilation::Expr*,long,SQCompilation::IncForm>
                  (in_stack_fffffffffffffea0,
                   (Expr *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),args_2);
        Node::lineStart((Node *)local_30);
        Node::columnStart((Node *)local_30);
        pSVar6 = (SQParser *)
                 setCoordinates<SQCompilation::IncExpr>
                           (in_stack_fffffffffffffe80,(IncExpr *)in_stack_fffffffffffffe78,
                            (SQInteger)in_stack_fffffffffffffe70,
                            (SQInteger)in_stack_fffffffffffffe68);
        Lex(in_stack_fffffffffffffe80);
        local_8 = pSVar6;
      }
      goto LAB_001ba392;
    }
    if (pSVar6 == (SQParser *)0x146) goto LAB_001b9ca1;
    if (pSVar6 == (SQParser *)0x147) goto LAB_001b9efd;
    if (pSVar6 == (SQParser *)0x149) goto LAB_001ba17e;
    if ((undefined1 *)0x1 < (undefined1 *)((long)&pSVar6[-2]._lex._sharedstate + 3U)) {
      local_8 = local_30;
LAB_001ba392:
      NestingChecker::~NestingChecker(&local_20);
      return (Expr *)local_8;
    }
  }
LAB_001b9ca1:
  if (((in_RDI->_token == 0x146) || (in_RDI->_token == 0x156)) || (local_3d != false)) {
    local_3d = true;
  }
  uVar7 = (undefined3)in_stack_ffffffffffffff3c;
  in_stack_ffffffffffffff3c = CONCAT13(1,uVar7);
  if (in_RDI->_token != 0x155) {
    in_stack_ffffffffffffff3c = CONCAT13(in_RDI->_token == 0x156,uVar7);
  }
  SVar1 = in_RDI->_token;
  Lex(in_stack_fffffffffffffe80);
  if (((in_RDI->_lex)._prevflags & 3) != 0) {
    pcVar5 = opname(SVar1);
    reportDiagnostic(in_RDI,0x35,pcVar5);
  }
  SVar1 = (in_RDI->_lex)._currentline;
  SVar2 = (in_RDI->_lex)._currentcolumn;
  this_00 = (Id *)Expect((SQParser *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                         in_stack_fffffffffffffeb8);
  Id::id(this_00);
  pSVar6 = (SQParser *)
           newNode<SQCompilation::GetFieldExpr,SQCompilation::Expr*,char_const*,bool,bool>
                     (in_stack_fffffffffffffea0,
                      (Expr *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                      (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      SUB81((ulong)in_stack_fffffffffffffe88 >> 0x38,0),
                      SUB81((ulong)in_stack_fffffffffffffe88 >> 0x30,0));
  iVar4 = Node::lineStart((Node *)local_30);
  Node::setLineStartPos((Node *)pSVar6,iVar4);
  iVar4 = Node::columnStart((Node *)local_30);
  Node::setColumnStartPos((Node *)pSVar6,iVar4);
  local_50 = (int)SVar1;
  Node::setLineEndPos((Node *)pSVar6,local_50);
  local_58 = (int)SVar2;
  Node::setColumnEndPos((Node *)pSVar6,local_58);
  local_30 = pSVar6;
  goto LAB_001b9bb3;
}

Assistant:

Expr* SQParser::PrefixedExpr()
{
    NestingChecker nc(this);
    //if 'pos' != -1 the previous variable is a local variable
    SQInteger pos;
    Expr *e = Factor(pos);
    bool nextIsNullable = false;
    for(;;) {
        nc.inc();
        switch(_token) {
        case _SC('.'):
        case TK_NULLGETSTR:
        case TK_TYPE_METHOD_GETSTR:
        case TK_NULLABLE_TYPE_METHOD_GETSTR: {
            if (_token == TK_NULLGETSTR || _token == TK_NULLABLE_TYPE_METHOD_GETSTR || nextIsNullable) {
                nextIsNullable = true;
            }

            bool isTypeMethod = _token == TK_TYPE_METHOD_GETSTR || _token == TK_NULLABLE_TYPE_METHOD_GETSTR;

            SQInteger tok = _token;

            Lex();

            if ((_lex._prevflags & (TF_PREP_SPACE | TF_PREP_EOL)) != 0) {
              reportDiagnostic(DiagnosticsId::DI_SPACE_SEP_FIELD_NAME, opname(tok));
            }

            SQInteger l = _lex._currentline, c = _lex._currentcolumn;
            Expr *receiver = e;
            Id *id = (Id *)Expect(TK_IDENTIFIER);
            assert(id);
            e = newNode<GetFieldExpr>(receiver, id->id(), nextIsNullable, isTypeMethod); //-V522
            e->setLineStartPos(receiver->lineStart()); e->setColumnStartPos(receiver->columnStart());
            e->setLineEndPos(l); e->setColumnEndPos(c);
            break;
        }
        case _SC('['):
        case TK_NULLGETOBJ: {
            if (_token == TK_NULLGETOBJ || nextIsNullable)
            {
                nextIsNullable = true;
            }
            if(_lex._prevtoken == _SC('\n'))
                reportDiagnostic(DiagnosticsId::DI_BROKEN_SLOT_DECLARATION);
            if (_token == _SC('['))
              checkSuspiciousBracket();

            Lex();
            Expr *receiver = e;
            Expr *key = Expression(SQE_RVALUE);
            e = setCoordinates(newNode<GetSlotExpr>(receiver, key, nextIsNullable), receiver->lineStart(), receiver->columnStart());
            Expect(_SC(']'));
            break;
        }
        case TK_MINUSMINUS:
        case TK_PLUSPLUS:
            {
                nextIsNullable = false;
                if(IsEndOfStatement()) return e;
                SQInteger diff = (_token==TK_MINUSMINUS) ? -1 : 1;
                e = setCoordinates(newNode<IncExpr>(e, diff, IF_POSTFIX), e->lineStart(), e->columnStart());
                Lex();
            }
            return e;
        case _SC('('):
        case TK_NULLCALL: {
            if (_lex._prevflags & TF_PREP_EOL && _token == _SC('(')) {
                reportDiagnostic(DiagnosticsId::DI_PAREN_IS_FUNC_CALL);
            }
            SQInteger nullcall = (_token==TK_NULLCALL || nextIsNullable);
            nextIsNullable = !!nullcall;
            SQInteger l = e->lineStart(), c = e->columnStart();
            CallExpr *call = newNode<CallExpr>(arena(), e, nullcall);

            if (_token == _SC('('))
              checkSuspiciousBracket();

            Lex();
            while (_token != _SC(')')) {
                call->addArgument(Expression(SQE_FUNCTION_ARG));
                if (_token == _SC(',')) {
                    Lex();
                }
            }

            setCoordinates(call, l, c);

            Lex();
            e = call;
            break;
        }
        default: return e;
        }
    }
}